

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O0

void do_cmd_drop(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *local_20;
  object *obj;
  command *pcStack_10;
  wchar_t amt;
  command *cmd_local;
  
  pcStack_10 = cmd;
  _Var1 = player_get_resume_normal_shape(player,(command_conflict *)cmd);
  if ((_Var1) &&
     (wVar2 = cmd_get_item(pcStack_10,"item",&local_20,"Drop which item?",
                           "You have nothing to drop.",(item_tester)0x0,L'\v'), wVar2 == L'\0')) {
    _Var1 = object_is_equipped(player->body,local_20);
    if ((!_Var1) || (_Var1 = obj_can_takeoff(local_20), _Var1)) {
      wVar2 = cmd_get_quantity(pcStack_10,"quantity",(int *)((long)&obj + 4),(uint)local_20->number)
      ;
      if (wVar2 == L'\0') {
        inven_drop(local_20,obj._4_4_);
        player->upkeep->energy_use = z_info->move_energy / 2;
      }
    }
    else {
      msg("Hmmm, it seems to be stuck.");
    }
  }
  return;
}

Assistant:

void do_cmd_drop(struct command *cmd)
{
	int amt;
	struct object *obj;

	if (!player_get_resume_normal_shape(player, cmd)) {
		return;
	}

	/* Get arguments */
	if (cmd_get_item(cmd, "item", &obj,
			/* Prompt */ "Drop which item?",
			/* Error  */ "You have nothing to drop.",
			/* Filter */ NULL,
			/* Choice */ USE_EQUIP | USE_INVEN | USE_QUIVER) != CMD_OK)
		return;

	/* Cannot remove stickied items */
	if (object_is_equipped(player->body, obj) && !obj_can_takeoff(obj)) {
		msg("Hmmm, it seems to be stuck.");
		return;
	}

	if (cmd_get_quantity(cmd, "quantity", &amt, obj->number) != CMD_OK)
		return;

	inven_drop(obj, amt);
	player->upkeep->energy_use = z_info->move_energy / 2;
}